

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O3

void __thiscall tinyxml2::MemPoolT<112>::Clear(MemPoolT<112> *this)

{
  int iVar1;
  
  iVar1 = (this->_blockPtrs)._size;
  while (iVar1 != 0) {
    (this->_blockPtrs)._size = iVar1 + -1;
    operator_delete((this->_blockPtrs)._mem[(long)iVar1 + -1]);
    iVar1 = (this->_blockPtrs)._size;
  }
  this->_root = (Item *)0x0;
  this->_currentAllocs = 0;
  this->_nAllocs = 0;
  this->_maxAllocs = 0;
  this->_nUntracked = 0;
  return;
}

Assistant:

void Clear() {
        // Delete the blocks.
        while( !_blockPtrs.Empty()) {
            Block* b  = _blockPtrs.Pop();
            delete b;
        }
        _root = 0;
        _currentAllocs = 0;
        _nAllocs = 0;
        _maxAllocs = 0;
        _nUntracked = 0;
    }